

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

void Llb_ManPrintSpan(Llb_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  uint local_30;
  uint local_2c;
  int SpanMax;
  int Span;
  int k;
  int i;
  Aig_Obj_t *pVar;
  Llb_Grp_t *pGroup;
  Llb_Man_t *p_local;
  
  local_2c = 0;
  local_30 = 0;
  for (Span = 0; iVar1 = Vec_PtrSize(p->vGroups), Span < iVar1; Span = Span + 1) {
    pvVar2 = Vec_PtrEntry(p->vGroups,Span);
    for (SpanMax = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 8)), SpanMax < iVar1;
        SpanMax = SpanMax + 1) {
      pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 8),SpanMax);
      iVar1 = Vec_IntEntry(p->vVarBegs,*(int *)((long)pvVar3 + 0x24));
      if (iVar1 == Span) {
        local_2c = local_2c + 1;
      }
    }
    for (SpanMax = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 0x10)), SpanMax < iVar1;
        SpanMax = SpanMax + 1) {
      pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 0x10),SpanMax);
      iVar1 = Vec_IntEntry(p->vVarBegs,*(int *)((long)pvVar3 + 0x24));
      if (iVar1 == Span) {
        local_2c = local_2c + 1;
      }
    }
    local_30 = Abc_MaxInt(local_30,local_2c);
    printf("%d ",(ulong)local_2c);
    for (SpanMax = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 8)), SpanMax < iVar1;
        SpanMax = SpanMax + 1) {
      pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 8),SpanMax);
      iVar1 = Vec_IntEntry(p->vVarEnds,*(int *)((long)pvVar3 + 0x24));
      if (iVar1 == Span) {
        local_2c = local_2c - 1;
      }
    }
    for (SpanMax = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 0x10)), SpanMax < iVar1;
        SpanMax = SpanMax + 1) {
      pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 0x10),SpanMax);
      iVar1 = Vec_IntEntry(p->vVarEnds,*(int *)((long)pvVar3 + 0x24));
      if (iVar1 == Span) {
        local_2c = local_2c - 1;
      }
    }
  }
  printf("\n");
  printf("Max = %d\n",(ulong)local_30);
  return;
}

Assistant:

void Llb_ManPrintSpan( Llb_Man_t * p )
{
    Llb_Grp_t * pGroup;
    Aig_Obj_t * pVar;
    int i, k, Span = 0, SpanMax = 0;
    Vec_PtrForEachEntry( Llb_Grp_t *, p->vGroups, pGroup, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) == i )
                Span++;
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) == i )
                Span++;

        SpanMax = Abc_MaxInt( SpanMax, Span );
printf( "%d ", Span );

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) == i )
                Span--;
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) == i )
                Span--;
    }
printf( "\n" );
printf( "Max = %d\n", SpanMax );
}